

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  TestCaseGroup *pTVar2;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  anon_struct_16_2_3f8b7511 *extraout_RAX;
  Vertex2DTextureCase *pVVar3;
  long lVar4;
  anon_struct_16_2_3f8b7511 *paVar5;
  VertexCubeTextureCase *pVVar6;
  long lVar7;
  allocator<char> local_141;
  long local_140;
  TestCaseGroup *local_138;
  anon_struct_16_2_3f8b7511 *local_130;
  anon_struct_16_2_3f8b7511 *local_128;
  VertexTextureTests *local_120;
  TestCaseGroup *local_118;
  long local_110;
  TestCaseGroup *local_108;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long local_c0;
  TestCaseGroup *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"2d","2D Vertex Texture Tests");
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"cube","Cube Map Vertex Texture Tests");
  local_138 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_138,(this->super_TestCaseGroup).m_context,"filtering",
             "2D Vertex Texture Filtering Tests");
  local_118 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_118,(this->super_TestCaseGroup).m_context,"wrap","2D Vertex Texture Wrap Tests");
  local_108 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_108,(this->super_TestCaseGroup).m_context,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"wrap",
             "Cube Map Vertex Texture Wrap Tests");
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)local_138);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)local_118);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)local_108);
  local_b8 = this_01;
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_120 = this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  lVar7 = 0;
  paVar5 = extraout_RAX;
  while (lVar7 != 6) {
    local_130 = init::minFilterModes + lVar7;
    lVar4 = 0;
    local_c0 = lVar7;
    while (lVar4 != 2) {
      local_128 = init::magFilterModes + lVar4;
      local_140 = 8;
      local_110 = lVar4;
      while( true ) {
        if (local_140 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_141);
        std::operator+(&local_70,&local_50,local_130->name);
        std::operator+(&local_e0,&local_70,"_");
        std::operator+(&local_b0,&local_e0,local_128->name);
        std::operator+(&local_90,&local_b0,"_");
        std::operator+(&name,&local_90,*(char **)(&UNK_01e1d188 + local_140));
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        pVVar3 = (Vertex2DTextureCase *)operator_new(0xa0);
        lVar7 = local_140;
        dVar1 = *(deUint32 *)((long)&init::wrapModes[0].name + local_140);
        Vertex2DTextureCase::Vertex2DTextureCase
                  (pVVar3,(local_120->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,local_130->mode,local_128->mode,dVar1,
                   dVar1);
        tcu::TestNode::addChild((TestNode *)local_138,(TestNode *)pVVar3);
        std::__cxx11::string::~string((string *)&name);
        local_140 = lVar7 + 0x10;
      }
      lVar4 = local_110 + 1;
    }
    paVar5 = (anon_struct_16_2_3f8b7511 *)0x2;
    lVar7 = local_c0 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 3) {
    paVar5 = init::wrapModes;
    local_140 = lVar7;
    for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_70);
      std::operator+(&local_b0,&local_e0,init::wrapModes[lVar7].name);
      std::operator+(&local_90,&local_b0,"_");
      std::operator+(&name,&local_90,*(char **)(&UNK_01e1d188 + lVar4));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_e0);
      pVVar3 = (Vertex2DTextureCase *)operator_new(0xa0);
      Vertex2DTextureCase::Vertex2DTextureCase
                (pVVar3,(local_120->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,0x2703,0x2601,init::wrapModes[lVar7].mode,
                 *(deUint32 *)((long)&init::wrapModes[0].name + lVar4));
      tcu::TestNode::addChild((TestNode *)local_118,(TestNode *)pVVar3);
      paVar5 = (anon_struct_16_2_3f8b7511 *)std::__cxx11::string::~string((string *)&name);
    }
    lVar7 = local_140 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 6) {
    local_130 = init::minFilterModes + lVar7;
    pTVar2 = (TestCaseGroup *)0x0;
    local_110 = lVar7;
    while (pTVar2 != (TestCaseGroup *)0x2) {
      local_128 = init::magFilterModes + (long)pTVar2;
      local_140 = 8;
      local_138 = pTVar2;
      while( true ) {
        if (local_140 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_141);
        std::operator+(&local_70,&local_50,local_130->name);
        std::operator+(&local_e0,&local_70,"_");
        std::operator+(&local_b0,&local_e0,local_128->name);
        std::operator+(&local_90,&local_b0,"_");
        std::operator+(&name,&local_90,*(char **)(&UNK_01e1d188 + local_140));
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        pVVar6 = (VertexCubeTextureCase *)operator_new(0xa0);
        lVar7 = local_140;
        dVar1 = *(deUint32 *)((long)&init::wrapModes[0].name + local_140);
        VertexCubeTextureCase::VertexCubeTextureCase
                  (pVVar6,(local_120->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,local_130->mode,local_128->mode,dVar1,
                   dVar1);
        tcu::TestNode::addChild((TestNode *)local_108,(TestNode *)pVVar6);
        std::__cxx11::string::~string((string *)&name);
        local_140 = lVar7 + 0x10;
      }
      pTVar2 = (TestCaseGroup *)
               ((long)&(local_138->super_TestCaseGroup).super_TestNode._vptr_TestNode + 1);
    }
    paVar5 = (anon_struct_16_2_3f8b7511 *)0x2;
    lVar7 = local_110 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 3) {
    paVar5 = init::wrapModes;
    local_140 = lVar7;
    for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_70);
      std::operator+(&local_b0,&local_e0,init::wrapModes[lVar7].name);
      std::operator+(&local_90,&local_b0,"_");
      std::operator+(&name,&local_90,*(char **)(&UNK_01e1d188 + lVar4));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_e0);
      pVVar6 = (VertexCubeTextureCase *)operator_new(0xa0);
      VertexCubeTextureCase::VertexCubeTextureCase
                (pVVar6,(local_120->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,0x2703,0x2601,init::wrapModes[lVar7].mode,
                 *(deUint32 *)((long)&init::wrapModes[0].name + lVar4));
      tcu::TestNode::addChild((TestNode *)local_b8,(TestNode *)pVVar6);
      paVar5 = (anon_struct_16_2_3f8b7511 *)std::__cxx11::string::~string((string *)&name);
    }
    lVar7 = local_140 + 1;
  }
  return (int)paVar5;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);

	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));
}